

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O0

Gem_Man_t * Gem_ManAlloc(int nVars,int fVerbose)

{
  int iVar1;
  Gem_Man_t *p_00;
  Gem_Obj_t *pGVar2;
  Vec_Mem_t *pVVar3;
  word **ppwVar4;
  Gem_Man_t *p;
  int fVerbose_local;
  int nVars_local;
  
  if (nVars < 0x11) {
    p_00 = (Gem_Man_t *)calloc(1,0x30);
    p_00->nVars = nVars;
    iVar1 = Abc_TtWordNum(nVars);
    p_00->nWords = iVar1;
    p_00->nObjsAlloc = 10000000;
    p_00->nObjs = 2;
    pGVar2 = (Gem_Obj_t *)calloc((long)p_00->nObjsAlloc,8);
    p_00->pObjs = pGVar2;
    *(uint *)(p_00->pObjs + 1) = *(uint *)(p_00->pObjs + 1) & 0xffff | 0x10000;
    *(uint *)(p_00->pObjs + 1) = *(uint *)(p_00->pObjs + 1) & 0xfffffff0 | 1;
    pVVar3 = Vec_MemAllocForTT(nVars,0);
    p_00->vTtMem = pVVar3;
    ppwVar4 = (word **)Extra_ArrayAlloc(nVars + 4,p_00->nWords,8);
    p_00->pTtElems = ppwVar4;
    p_00->fVerbose = fVerbose;
    Abc_TtElemInit(p_00->pTtElems,nVars);
    Gem_PrintNode(p_00,1,"Original",0);
    return p_00;
  }
  __assert_fail("nVars <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                ,0x5a,"Gem_Man_t *Gem_ManAlloc(int, int)");
}

Assistant:

Gem_Man_t * Gem_ManAlloc( int nVars, int fVerbose )
{
    Gem_Man_t * p;
    assert( nVars <= 16 );
    p = ABC_CALLOC( Gem_Man_t, 1 );
    p->nVars      = nVars;
    p->nWords     = Abc_TtWordNum( nVars );
    p->nObjsAlloc = 10000000;
    p->nObjs      = 2;
    p->pObjs      = ABC_CALLOC( Gem_Obj_t, p->nObjsAlloc );
    p->pObjs[1].nVars = p->pObjs[1].Groups = 1; // buffer
    p->vTtMem     = Vec_MemAllocForTT( nVars, 0 );
    p->pTtElems   = (word **)Extra_ArrayAlloc( nVars + 4, p->nWords, sizeof(word) );
    p->fVerbose   = fVerbose;
    Abc_TtElemInit( p->pTtElems, nVars );
    Gem_PrintNode( p, 1, "Original", 0 );
    return p;
}